

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper2.cpp
# Opt level: O1

void test_cpp_wrapper_equality_duplicates(planck_unit_test_t *tc,Dictionary<int,_int> *dict,int key)

{
  long lVar1;
  int *expected_values;
  int key_00;
  int value;
  int value_00;
  ulong uVar2;
  undefined8 uStack_50;
  ulong local_48;
  int *local_40;
  int local_34;
  
  lVar1 = -((ulong)(uint)key * 4 + 0xf & 0xfffffffffffffff0);
  local_40 = (int *)((long)&local_48 + lVar1);
  if (0 < key) {
    uVar2 = 0;
    value = 0;
    local_48 = (ulong)(uint)key;
    local_34 = key;
    do {
      key_00 = local_34;
      value_00 = value + 2;
      *(undefined8 *)((long)&uStack_50 + lVar1) = 0x104e7b;
      cpp_wrapper_insert(tc,dict,key_00,value_00,'\0');
      local_40[uVar2] = value_00;
      *(undefined8 *)((long)&uStack_50 + lVar1) = 0x104e96;
      cpp_wrapper_insert(tc,dict,(int)uVar2,value,'\0');
      uVar2 = uVar2 + 1;
      value = value_00;
      key = local_34;
    } while (local_48 != uVar2);
  }
  expected_values = local_40;
  *(undefined8 *)((long)&uStack_50 + lVar1) = 0x104ec0;
  cpp_wrapper_equality(tc,dict,key,expected_values,key,'\x01');
  return;
}

Assistant:

void
test_cpp_wrapper_equality_duplicates(
	planck_unit_test_t *tc,
	Dictionary<int, int> *dict,
	int key
) {
	int values[key];

	for (int i = 1; i <= key; i++) {
		cpp_wrapper_insert(tc, dict, key, i * 2, boolean_false);
		values[i - 1] = i * 2;

		cpp_wrapper_insert(tc, dict, i - 1, (i - 1) * 2, boolean_false);
	}

	cpp_wrapper_equality(tc, dict, key, values, key, boolean_true);
}